

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoop.cpp
# Opt level: O0

void __thiscall brynet::net::EventLoop::pushAsyncProc(EventLoop *this,USER_PROC *f)

{
  bool bVar1;
  lock_guard<std::mutex> local_20;
  lock_guard<std::mutex> lck;
  USER_PROC *f_local;
  EventLoop *this_local;
  
  lck._M_device = (mutex_type *)f;
  bVar1 = isInLoopThread(this);
  if (bVar1) {
    std::function<void_()>::operator()(f);
  }
  else {
    std::lock_guard<std::mutex>::lock_guard(&local_20,&this->mAsyncProcsMutex);
    std::vector<std::function<void()>,std::allocator<std::function<void()>>>::
    emplace_back<std::function<void()>>
              ((vector<std::function<void()>,std::allocator<std::function<void()>>> *)
               &this->mAsyncProcs,f);
    std::lock_guard<std::mutex>::~lock_guard(&local_20);
    wakeup(this);
  }
  return;
}

Assistant:

void EventLoop::pushAsyncProc(USER_PROC f)
{
    if (isInLoopThread())
    {
        f();
    }
    else
    {
        {
            std::lock_guard<std::mutex> lck(mAsyncProcsMutex);
            mAsyncProcs.emplace_back(std::move(f));
        }
        wakeup();
    }
}